

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocumentfragment.cpp
# Opt level: O2

void __thiscall
QTextDocumentFragmentPrivate::insert(QTextDocumentFragmentPrivate *this,QTextCursor *_cursor)

{
  byte bVar1;
  QTextDocumentPrivate *this_00;
  bool bVar2;
  QTextCursorPrivate *pQVar3;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *dst;
  long in_FS_OFFSET;
  QTextCopyHelper local_a0;
  QTextCursor sourceCursor;
  QTextFormat local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QTextCursor::isNull(_cursor);
  if (!bVar2) {
    pQVar3 = QSharedDataPointer<QTextCursorPrivate>::operator->(&_cursor->d);
    this_00 = pQVar3->priv;
    QTextDocumentPrivate::beginEditBlock(this_00);
    sourceCursor.d.d.ptr = (QSharedDataPointer<QTextCursorPrivate>)&DAT_aaaaaaaaaaaaaaaa;
    QTextCursor::QTextCursor(&sourceCursor,this->doc);
    QTextCursor::movePosition(&sourceCursor,End,KeepAnchor,1);
    bVar1 = this->field_0x10;
    QTextCursor::charFormat((QTextCursor *)&local_48);
    dst = (EVP_PKEY_CTX *)&sourceCursor;
    QTextCopyHelper::QTextCopyHelper
              (&local_a0,&sourceCursor,_cursor,(bool)(bVar1 & 1),(QTextCharFormat *)&local_48);
    QTextCopyHelper::copy(&local_a0,dst,src);
    QTextCopyHelper::~QTextCopyHelper(&local_a0);
    QTextFormat::~QTextFormat(&local_48);
    QTextDocumentPrivate::endEditBlock(this_00);
    QTextCursor::~QTextCursor(&sourceCursor);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextDocumentFragmentPrivate::insert(QTextCursor &_cursor) const
{
    if (_cursor.isNull())
        return;

    QTextDocumentPrivate *destPieceTable = _cursor.d->priv;
    destPieceTable->beginEditBlock();

    QTextCursor sourceCursor(doc);
    sourceCursor.movePosition(QTextCursor::End, QTextCursor::KeepAnchor);
    QTextCopyHelper(sourceCursor, _cursor, importedFromPlainText, _cursor.charFormat()).copy();

    destPieceTable->endEditBlock();
}